

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O1

void __thiscall tiger::trains::ai::LineBlocker::makeOwnBlockLines(LineBlocker *this)

{
  set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
  *this_00;
  Train *otherTrain;
  IPost *pIVar1;
  pointer ppLVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  World *this_01;
  _Base_ptr p_Var7;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar8;
  Line *pLVar9;
  Line *pLVar10;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *pvVar11;
  undefined4 extraout_var;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar12;
  pointer ppTVar13;
  pointer ppLVar14;
  pointer ppTVar15;
  pointer ppIVar16;
  _Rb_tree_header *p_Var17;
  pair<int,_tiger::trains::ai::LineBlock> blockLine;
  CollisionAllower allower;
  undefined1 local_68 [16];
  _Base_ptr local_58;
  pointer local_50;
  LineBlocker *local_48;
  World *local_40;
  CollisionAllower local_38;
  
  CollisionAllower::CollisionAllower(&local_38);
  this_01 = world::Train::getWorld(this->train);
  this_00 = &this->ownBlockLine;
  std::
  _Rb_tree<tiger::trains::ai::LineBlock,_tiger::trains::ai::LineBlock,_std::_Identity<tiger::trains::ai::LineBlock>,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
  ::clear(&this_00->_M_t);
  p_Var7 = (this->blockLines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var17 = &(this->blockLines->_M_t)._M_impl.super__Rb_tree_header;
  local_48 = this;
  if ((_Rb_tree_header *)p_Var7 != p_Var17) {
    do {
      local_68._0_8_ = *(undefined8 *)(p_Var7 + 1);
      local_68._8_8_ = p_Var7[1]._M_parent;
      local_58 = p_Var7[1]._M_left;
      uVar3 = local_68._0_4_;
      iVar5 = world::Train::getIdx(local_48->train);
      if (uVar3 != iVar5) {
        std::
        _Rb_tree<tiger::trains::ai::LineBlock,tiger::trains::ai::LineBlock,std::_Identity<tiger::trains::ai::LineBlock>,std::less<tiger::trains::ai::LineBlock>,std::allocator<tiger::trains::ai::LineBlock>>
        ::_M_insert_unique<tiger::trains::ai::LineBlock_const&>
                  ((_Rb_tree<tiger::trains::ai::LineBlock,tiger::trains::ai::LineBlock,std::_Identity<tiger::trains::ai::LineBlock>,std::less<tiger::trains::ai::LineBlock>,std::allocator<tiger::trains::ai::LineBlock>>
                    *)this_00,(LineBlock *)(local_68 + 8));
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var17);
  }
  local_40 = this_01;
  pvVar8 = world::World::getTrainList(this_01);
  ppTVar15 = (pvVar8->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppTVar13 = (pvVar8->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar15 != ppTVar13) {
    local_50 = ppTVar13;
    do {
      otherTrain = *ppTVar15;
      bVar4 = CollisionAllower::isCollisionAllow(&local_38,local_48->train,otherTrain);
      if (bVar4) {
        pLVar9 = world::Train::getLine(otherTrain);
        pLVar10 = world::Train::getLine(otherTrain);
        local_68._8_8_ = world::Line::getStartPont(pLVar10);
        local_68._0_8_ = pLVar9;
        std::
        _Rb_tree<tiger::trains::ai::LineBlock,_tiger::trains::ai::LineBlock,_std::_Identity<tiger::trains::ai::LineBlock>,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
        ::_M_insert_unique<tiger::trains::ai::LineBlock>(&this_00->_M_t,(LineBlock *)local_68);
        pLVar9 = world::Train::getLine(otherTrain);
        pLVar10 = world::Train::getLine(otherTrain);
        local_68._8_8_ = world::Line::getEndPont(pLVar10);
        ppTVar13 = local_50;
        local_68._0_8_ = pLVar9;
        std::
        _Rb_tree<tiger::trains::ai::LineBlock,_tiger::trains::ai::LineBlock,_std::_Identity<tiger::trains::ai::LineBlock>,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
        ::_M_insert_unique<tiger::trains::ai::LineBlock>(&this_00->_M_t,(LineBlock *)local_68);
      }
      ppTVar15 = ppTVar15 + 1;
    } while (ppTVar15 != ppTVar13);
  }
  pvVar11 = world::World::getPostList(local_40);
  ppIVar16 = (pvVar11->
             super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (pointer)(pvVar11->
                      super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)ppIVar16 != local_50) {
    do {
      pIVar1 = *ppIVar16;
      iVar5 = (*pIVar1->_vptr_IPost[7])(pIVar1);
      if (iVar5 != 1) {
        iVar6 = (*pIVar1->_vptr_IPost[7])(pIVar1);
        iVar5 = (uint)(local_48->type == ARMOR) * 3;
        if (local_48->type == PRODUCT) {
          iVar5 = 2;
        }
        if (iVar6 != iVar5) {
          iVar5 = (*pIVar1->_vptr_IPost[5])(pIVar1);
          pvVar12 = world::Point::getEdges((Point *)CONCAT44(extraout_var,iVar5));
          ppLVar2 = (pvVar12->
                    super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (ppLVar14 = (pvVar12->
                          super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                          )._M_impl.super__Vector_impl_data._M_start; ppLVar14 != ppLVar2;
              ppLVar14 = ppLVar14 + 1) {
            pLVar9 = *ppLVar14;
            local_68._8_8_ = world::Line::getStartPont(pLVar9);
            local_68._0_8_ = pLVar9;
            std::
            _Rb_tree<tiger::trains::ai::LineBlock,_tiger::trains::ai::LineBlock,_std::_Identity<tiger::trains::ai::LineBlock>,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
            ::_M_insert_unique<tiger::trains::ai::LineBlock>(&this_00->_M_t,(LineBlock *)local_68);
          }
        }
      }
      ppIVar16 = ppIVar16 + 1;
    } while ((pointer)ppIVar16 != local_50);
  }
  return;
}

Assistant:

void LineBlocker::makeOwnBlockLines()
{
    CollisionAllower allower;

    world::World *world = train->getWorld();


    ownBlockLine.clear();

    for (auto blockLine: *blockLines)
    {
        if (blockLine.first != train->getIdx())
        {
            ownBlockLine.insert(blockLine.second);
        }
    }

    for(auto trainA : world->getTrainList())
    {

        if (allower.isCollisionAllow(train, trainA))
        {
            ownBlockLine.insert({trainA->getLine(),trainA->getLine()->getStartPont()});
            ownBlockLine.insert({trainA->getLine(),trainA->getLine()->getEndPont()});
        }

    }

    for(auto post : world->getPostList())

    {
        if (post->getPostType() == models::PostType::TOWN ||
                post->getPostType() == getPostTypeByGood(type))
            continue;

        for (auto line : post->getPoint()->getEdges())
        {
            ownBlockLine.insert({line, line->getStartPont()});
        }
    }
}